

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O3

Mig_Man_t * Mig_ManCreate(void *pGia)

{
  char *__s;
  long lVar1;
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  Mig_Fan_t MVar5;
  int iVar6;
  Mig_Man_t *p;
  size_t sVar7;
  char *__dest;
  Mig_Fan_t *pMVar8;
  Mig_Obj_t *pMVar9;
  uint *puVar10;
  ulong uVar11;
  Mig_Fan_t MVar12;
  uint uVar13;
  Mig_Fan_t MVar14;
  uint uVar15;
  Mig_Fan_t MVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  Mig_Fan_t MVar20;
  Mig_Fan_t MVar21;
  uint uVar22;
  
  __dest = (char *)0x0;
  p = Mig_ManStart();
  __s = *pGia;
  if (__s != (char *)0x0) {
    sVar7 = strlen(__s);
    __dest = (char *)malloc(sVar7 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  *(undefined4 *)(*(long *)((long)pGia + 0x20) + 8) = 0;
  uVar11 = (ulong)*(uint *)((long)pGia + 0x18);
  if (1 < (int)*(uint *)((long)pGia + 0x18)) {
    lVar18 = 1;
    lVar19 = 0x14;
    do {
      lVar1 = *(long *)((long)pGia + 0x20);
      lVar2 = *(long *)((long)pGia + 0x28);
      if ((lVar2 == 0) || (*(int *)(lVar2 + lVar18 * 4) == 0)) {
        uVar11 = *(ulong *)(lVar1 + -8 + lVar19);
        uVar22 = (uint)uVar11;
        iVar6 = (int)(uVar11 & 0x1fffffff);
        uVar13 = (uint)(uVar11 >> 0x20);
        if (((uVar11 & 0x1fffffff) == 0x1fffffff || (int)uVar22 < 0) ||
           ((uVar13 & 0x1fffffff) <= (uVar22 & 0x1fffffff))) {
          if (iVar6 == 0x1fffffff || (int)uVar22 < 0) {
            if ((~uVar22 & 0x9fffffff) == 0) {
              pMVar9 = Mig_ManAppendObj(p);
              if ((uint)pMVar9->pFans[1] < 0xfffffffe) {
LAB_008d125a:
                __assert_fail("Mig_FanIsNone(p, 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                              ,0x95,"void Mig_ObjSetCioId(Mig_Obj_t *, int)");
              }
              uVar13 = (p->vCis).nSize;
              if (0x7ffffffe < uVar13) {
LAB_008d121c:
                __assert_fail("v >= 0 && v < MIG_NONE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                              ,0x81,"int Mig_FanSetId(Mig_Obj_t *, int, int)");
              }
              pMVar9->pFans[2] = (Mig_Fan_t)(((uint)pMVar9->pFans[2] & 1) + uVar13 * 2);
              Vec_IntPush(&p->vCis,(uint)pMVar9->pFans[3] >> 1);
              MVar12 = pMVar9->pFans[3];
            }
            else {
              if ((-1 < (int)uVar22) || (iVar6 == 0x1fffffff)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmAbc.c"
                              ,0x68,"Mig_Man_t *Mig_ManCreate(void *)");
              }
              uVar13 = *(uint *)(lVar1 + (ulong)(uint)(iVar6 << 2) * -3 + lVar19);
              if ((int)uVar13 < 0) goto LAB_008d1181;
              uVar15 = uVar13 >> 1;
              if (p->nObjs <= (int)uVar15) {
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                              ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
              }
              if ((p->vPages).nSize <= (int)(uVar13 >> 0xd)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar4 = (p->vPages).pArray[uVar13 >> 0xd];
              uVar11 = (ulong)((uVar15 & 0xfff) << 4);
              if (((0xfffffffd < *(uint *)((long)pvVar4 + uVar11 + 4)) &&
                  (puVar10 = (uint *)((long)pvVar4 + uVar11), puVar10[2] < 0xfffffffe)) &&
                 (*puVar10 < 0xfffffffe)) {
                __assert_fail("!Mig_ObjIsCo(Mig_ManObj(p, Abc_Lit2Var(iLit0)))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                              ,0xf8,"int Mig_ManAppendCo(Mig_Man_t *, int)");
              }
              pMVar9 = Mig_ManAppendObj(p);
              uVar17 = (uint)pMVar9->pFans[3] >> 1;
              if (uVar17 <= uVar15) goto LAB_008d1162;
              pMVar9->pFans[0] = (Mig_Fan_t)(uVar22 >> 0x1d & 1 ^ uVar13);
              if ((uint)pMVar9->pFans[1] < 0xfffffffe) goto LAB_008d125a;
              uVar13 = (p->vCos).nSize;
              if (0x7ffffffe < uVar13) goto LAB_008d121c;
              pMVar9->pFans[2] = (Mig_Fan_t)(((uint)pMVar9->pFans[2] & 1) + uVar13 * 2);
              Vec_IntPush(&p->vCos,uVar17);
              MVar12 = pMVar9->pFans[3];
            }
          }
          else {
            uVar22 = *(uint *)(lVar1 + (ulong)(uint)(iVar6 << 2) * -3 + lVar19);
            if (((int)uVar22 < 0) ||
               (uVar15 = *(uint *)(lVar1 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3 +
                                  lVar19), (int)uVar15 < 0)) goto LAB_008d1181;
            MVar20 = (Mig_Fan_t)(uVar22 ^ (uint)(uVar11 >> 0x1d) & 1);
            MVar14 = (Mig_Fan_t)(uVar15 ^ uVar13 >> 0x1d & 1);
            pMVar8 = Mig_ManAppendObj(p)->pFans;
            if (MVar20 == MVar14) {
              __assert_fail("iLit0 != iLit1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                            ,0x109,"int Mig_ManAppendAnd(Mig_Man_t *, int, int)");
            }
            MVar21 = MVar14;
            if ((uint)MVar20 < (uint)MVar14) {
              MVar21 = MVar20;
            }
            MVar12 = pMVar8[3];
            if ((uint)MVar12 >> 1 <= (uint)MVar21 >> 1) goto LAB_008d1162;
            if ((uint)MVar14 < (uint)MVar20) {
              MVar14 = MVar20;
            }
            *pMVar8 = MVar21;
            if ((uint)MVar12 >> 1 <= (uint)MVar14 >> 1) goto LAB_008d1162;
            pMVar8[1] = MVar14;
          }
        }
        else {
          uVar22 = *(uint *)(lVar1 + (ulong)(uint)(iVar6 << 2) * -3 + lVar19);
          if (((int)uVar22 < 0) ||
             (uVar15 = *(uint *)(lVar1 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3 + lVar19),
             (int)uVar15 < 0)) goto LAB_008d1181;
          MVar20 = (Mig_Fan_t)(uVar22 ^ (uint)(uVar11 >> 0x1d) & 1);
          MVar14 = (Mig_Fan_t)(uVar15 ^ uVar13 >> 0x1d & 1);
          pMVar8 = Mig_ManAppendObj(p)->pFans;
          if (MVar20 == MVar14) {
            __assert_fail("iLit0 != iLit1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                          ,0x111,"int Mig_ManAppendXor(Mig_Man_t *, int, int)");
          }
          if ((((uint)MVar20 | (uint)MVar14) & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                          ,0x112,"int Mig_ManAppendXor(Mig_Man_t *, int, int)");
          }
          MVar21 = MVar14;
          if ((uint)MVar14 < (uint)MVar20) {
            MVar21 = MVar20;
          }
          MVar12 = pMVar8[3];
          if ((uint)MVar12 >> 1 <= (uint)MVar21 >> 1) goto LAB_008d1162;
          if ((uint)MVar20 < (uint)MVar14) {
            MVar14 = MVar20;
          }
          *pMVar8 = MVar21;
          if ((uint)MVar12 >> 1 <= (uint)MVar14 >> 1) goto LAB_008d1162;
          pMVar8[1] = MVar14;
        }
      }
      else {
        uVar3 = *(ulong *)(lVar1 + -8 + lVar19);
        uVar13 = *(uint *)(lVar1 + lVar19 + (ulong)(((uint)uVar3 & 0x1fffffff) << 2) * -3);
        if (((int)uVar13 < 0) ||
           (uVar22 = *(uint *)(lVar1 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3 + lVar19),
           (int)uVar22 < 0)) {
LAB_008d1181:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar15 = *(uint *)(lVar2 + lVar18 * 4);
        if ((int)uVar15 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if ((uint)uVar11 <= uVar15 >> 1) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar17 = *(uint *)(lVar1 + 8 + (ulong)(uVar15 >> 1) * 0xc);
        if ((int)uVar17 < 0) goto LAB_008d1181;
        MVar14 = (Mig_Fan_t)(uVar22 ^ (uint)(uVar3 >> 0x3d) & 1);
        MVar20 = (Mig_Fan_t)(uVar15 & 1 ^ uVar17);
        pMVar8 = Mig_ManAppendObj(p)->pFans;
        if (((MVar14 == MVar20) ||
            (MVar21 = (Mig_Fan_t)((uint)uVar3 >> 0x1d & 1 ^ uVar13), MVar21 == MVar14)) ||
           (MVar21 == MVar20)) {
          __assert_fail("iLit0 != iLit1 && iLit0 != iCtrl && iLit1 != iCtrl",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0x11a,"int Mig_ManAppendMux(Mig_Man_t *, int, int, int)");
        }
        if ((((uint)MVar21 & 1) != 0) && (((uint)MVar14 & 1) != 0)) {
          __assert_fail("!Abc_LitIsCompl(iLit0) || !Abc_LitIsCompl(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0x11b,"int Mig_ManAppendMux(Mig_Man_t *, int, int, int)");
        }
        MVar16 = MVar14;
        if ((uint)MVar21 < (uint)MVar14) {
          MVar16 = MVar21;
        }
        MVar12 = pMVar8[3];
        uVar13 = (uint)MVar12 >> 1;
        if (uVar13 <= (uint)MVar16 >> 1) {
LAB_008d1162:
          __assert_fail("l >= 0 && (l >> 1) < Mig_ObjId(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0xba,"void Mig_ObjSetFaninLit(Mig_Obj_t *, int, int)");
        }
        MVar5 = MVar14;
        if ((uint)MVar14 < (uint)MVar21) {
          MVar5 = MVar21;
        }
        *pMVar8 = MVar16;
        if ((uVar13 <= (uint)MVar5 >> 1) || (pMVar8[1] = MVar5, uVar13 <= uVar17 >> 1))
        goto LAB_008d1162;
        pMVar8[2] = (Mig_Fan_t)((uint)MVar20 ^ (uint)((uint)MVar14 <= (uint)MVar21));
      }
      *(uint *)(lVar1 + lVar19) = (uint)MVar12 & 0xfffffffe;
      lVar18 = lVar18 + 1;
      uVar11 = (ulong)*(int *)((long)pGia + 0x18);
      lVar19 = lVar19 + 0xc;
    } while (lVar18 < (long)uVar11);
  }
  p->nRegs = *(int *)((long)pGia + 0x10);
  if (*(long *)((long)pGia + 0xd0) != 0) {
    Mig_ManCreateChoices(p,(Gia_Man_t *)pGia);
  }
  return p;
}

Assistant:

Mig_Man_t * Mig_ManCreate( void * pGia )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Mig_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Mig_ManStart();
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Mig_ManAppendMux( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin2Copy(p, pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Mig_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Mig_ManAppendAnd( pNew, Mig_ObjFanin0Copy(pObj), Mig_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Mig_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Mig_ManAppendCo( pNew, Mig_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    Mig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    if ( Gia_ManHasChoices(p) )
        Mig_ManCreateChoices( pNew, p );
    return pNew;
}